

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
StringInstance::StringInstance
          (StringInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined8 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4a;
  undefined1 in_stack_ffffffffffffff4b;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  Instance *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [7];
  char in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa8;
  allocator local_39;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"String",&local_39);
  Instance::Instance(in_stack_ffffffffffffff50,
                     (string *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT15(in_stack_ffffffffffffff4d,
                                                CONCAT14(in_stack_ffffffffffffff4c,
                                                         CONCAT13(in_stack_ffffffffffffff4b,
                                                                  CONCAT12(in_stack_ffffffffffffff4a
                                                                           ,
                                                  in_stack_ffffffffffffff48)))))));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__StringInstance_0020edf0;
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  uVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((!(bool)uVar1) &&
     (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), !bVar2)) {
    bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((!bVar2) &&
       (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), !bVar2)) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "RuntimeError: invalid message.";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_18);
    if (sVar3 != 2) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "RuntimeError: wrong number of arguments.";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    bVar2 = Grammar::is_variable(in_stack_ffffffffffffffa8);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,1);
      bVar2 = Grammar::is_string_value((string *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
      if (bVar2) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_18,0);
        std::__cxx11::string::operator=((string *)(in_RDI + 7),(string *)pvVar4);
        sVar3 = 1;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_18,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,sVar3);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_90,(ulong)pvVar4);
        str_utils::unescape(in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
        std::__cxx11::string::operator=((string *)(in_RDI + 0xb),local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
        return;
      }
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  if (sVar3 != 1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar2 = Grammar::is_variable(in_stack_ffffffffffffffa8);
  if (bVar2) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    std::__cxx11::string::operator=((string *)(in_RDI + 7),(string *)pvVar4);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xb),"");
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

StringInstance::StringInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("String") {
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = "";
    }
    else if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_string_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = str_utils::unescape(arguments[1].substr(1, int(arguments[1].size()) - 2), '"');
    }
    else
        throw EXC_INVALID_MESSAGE;
}